

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int match_pattern(char *tp,char *pp)

{
  bool bVar1;
  bool bVar2;
  char *pcStack_30;
  int inastr;
  char *psp;
  char *tsp;
  char *pp_local;
  char *tp_local;
  
  bVar1 = false;
  pcStack_30 = pp;
  psp = tp;
  tsp = pp;
  pp_local = tp;
  do {
    if (*tsp == '\0') {
      return (uint)(*pp_local == '\0');
    }
    if (*tsp == '*') {
      for (; *tsp == '*'; tsp = tsp + 1) {
      }
      if (*tsp == '\0') {
        return 1;
      }
      pcStack_30 = tsp;
      while( true ) {
        bVar1 = false;
        if (*pp_local != *tsp) {
          bVar1 = *pp_local != '\0';
        }
        if (!bVar1) break;
        pp_local = pp_local + 1;
      }
      if (*pp_local == '\0') {
        return 0;
      }
      psp = pp_local;
      bVar1 = true;
    }
    else if (*pp_local != *tsp) {
      if (!bVar1) {
        return 0;
      }
      do {
        pp_local = psp + 1;
        bVar2 = false;
        if (*pp_local != '\0') {
          bVar2 = *pp_local != *pcStack_30;
        }
        psp = pp_local;
      } while (bVar2);
      if (*pp_local == '\0') {
        return 0;
      }
      tsp = pcStack_30;
    }
    pp_local = pp_local + 1;
    tsp = tsp + 1;
  } while( true );
}

Assistant:

int match_pattern(char *tp, char *pp)
{
  char *tsp, *psp;
  int inastr;

#ifdef DOS
  /* % is not allowed in DOS names for Medley. */
  if (strchr(tp, '%')) return 0;

#endif /* DOS */

  for (tsp = tp, psp = pp, inastr = 0;; tp++, pp++) {
    switch (*pp) {
      case '\0': return ((*tp == '\0') ? 1 : 0);

      case '*':
        while (*pp == '*') pp++; /* Skip successive '*'s. */
        if (*pp == '\0') return (1);

        psp = pp;
        while (*tp != *pp && *tp != '\0') tp++;

        if (*tp == '\0') return (0);

        tsp = tp;
        inastr = 1;

        continue;

      default:
        if (*tp == *pp) continue;

        if (inastr) {
          /*
           * Try to find a character which match to
           * a character psp points from a character
           * next to tsp.  If found retry from there.
           */
          for (tp = tsp + 1; *tp != '\0' && *tp != *psp; tp++) {}
          if (*tp == '\0') return (0);
          pp = psp;
          tsp = tp;
          continue;
        } else {
          return (0);
        }
    }
  }
}